

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ForeachLoopStatementSyntax::setChild
          (ForeachLoopStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0040851c + *(int *)(&DAT_0040851c + index * 4)))();
  return;
}

Assistant:

void ForeachLoopStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: keyword = child.token(); return;
        case 3: loopList = child.node() ? &child.node()->as<ForeachLoopListSyntax>() : nullptr; return;
        case 4: statement = child.node() ? &child.node()->as<StatementSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}